

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

void __thiscall wasm::TypeBuilder::createRecGroup(TypeBuilder *this,size_t index,size_t length)

{
  bool bVar1;
  unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
  *puVar2;
  size_t sVar3;
  ulong uVar4;
  pointer pvVar5;
  pointer pIVar6;
  pointer pHVar7;
  RecGroup local_68;
  pair<const_wasm::RecGroup,_std::unique_ptr<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
  local_60;
  value_type local_50;
  reference local_48;
  unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
  *info;
  size_t i;
  unique_ptr<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
  local_28;
  __single_object groupInfo;
  size_t length_local;
  size_t index_local;
  TypeBuilder *this_local;
  
  groupInfo._M_t.
  super___uniq_ptr_impl<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_*,_std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
  .super__Head_base<0UL,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_*,_false>.
  _M_head_impl = (__uniq_ptr_data<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_true,_true>
                  )(__uniq_ptr_data<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_true,_true>
                    )length;
  sVar3 = size(this);
  bVar1 = false;
  if (index <= sVar3) {
    uVar4 = index + (long)groupInfo._M_t.
                          super___uniq_ptr_impl<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_*,_std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                          .
                          super__Head_base<0UL,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_*,_false>
                          ._M_head_impl;
    sVar3 = size(this);
    bVar1 = false;
    if (uVar4 <= sVar3) {
      bVar1 = true;
    }
  }
  if (!bVar1) {
    __assert_fail("index <= size() && index + length <= size() && \"group out of bounds\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                  ,0x932,"void wasm::TypeBuilder::createRecGroup(size_t, size_t)");
  }
  if (1 < (ulong)groupInfo._M_t.
                 super___uniq_ptr_impl<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_*,_std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                 .
                 super__Head_base<0UL,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_*,_false>
                 ._M_head_impl) {
    std::make_unique<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>();
    pvVar5 = std::
             unique_ptr<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
             ::operator->(&local_28);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::reserve
              (pvVar5,(size_type)
                      groupInfo._M_t.
                      super___uniq_ptr_impl<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_*,_std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                      .
                      super__Head_base<0UL,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_*,_false>
                      ._M_head_impl);
    for (info = (unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
                 *)0x0;
        info < (ulong)groupInfo._M_t.
                      super___uniq_ptr_impl<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_*,_std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                      .
                      super__Head_base<0UL,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_*,_false>
                      ._M_head_impl;
        info = (unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
                *)((long)&(info->_M_t).
                          super___uniq_ptr_impl<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::HeapTypeInfo_*,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
                          .super__Head_base<0UL,_wasm::(anonymous_namespace)::HeapTypeInfo_*,_false>
                          ._M_head_impl + 1)) {
      pIVar6 = std::
               unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>::
               operator->(&this->impl);
      local_48 = std::
                 vector<wasm::TypeBuilder::Impl::Entry,_std::allocator<wasm::TypeBuilder::Impl::Entry>_>
                 ::operator[](&pIVar6->entries,
                              (long)&(info->_M_t).
                                     super___uniq_ptr_impl<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_wasm::(anonymous_namespace)::HeapTypeInfo_*,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
                                     .
                                     super__Head_base<0UL,_wasm::(anonymous_namespace)::HeapTypeInfo_*,_false>
                                     ._M_head_impl + index);
      pHVar7 = std::
               unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
               ::operator->(&local_48->info);
      if (pHVar7->recGroup != (RecGroupInfo_conflict *)0x0) {
        __assert_fail("info->recGroup == nullptr && \"group already assigned\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                      ,0x93b,"void wasm::TypeBuilder::createRecGroup(size_t, size_t)");
      }
      pvVar5 = std::
               unique_ptr<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
               ::operator->(&local_28);
      local_50.id = (uintptr_t)anon_unknown_0::asHeapType(&local_48->info);
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::push_back(pvVar5,&local_50);
      pvVar5 = std::
               unique_ptr<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
               ::get(&local_28);
      pHVar7 = std::
               unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
               ::operator->(&local_48->info);
      puVar2 = info;
      pHVar7->recGroup = pvVar5;
      pHVar7 = std::
               unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
               ::operator->(&local_48->info);
      pHVar7->recGroupIndex = (size_t)puVar2;
    }
    pIVar6 = std::unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
             ::operator->(&this->impl);
    pvVar5 = std::
             unique_ptr<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
             ::get(&local_28);
    RecGroup::RecGroup(&local_68,(uintptr_t)pvVar5);
    std::
    pair<const_wasm::RecGroup,_std::unique_ptr<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
    ::
    pair<wasm::RecGroup,_std::unique_ptr<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_true>
              (&local_60,&local_68,&local_28);
    std::
    unordered_map<wasm::RecGroup,_std::unique_ptr<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::hash<wasm::RecGroup>,_std::equal_to<wasm::RecGroup>,_std::allocator<std::pair<const_wasm::RecGroup,_std::unique_ptr<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>_>_>
    ::insert(&pIVar6->recGroups,&local_60);
    std::
    pair<const_wasm::RecGroup,_std::unique_ptr<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
    ::~pair(&local_60);
    std::
    unique_ptr<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
    ::~unique_ptr(&local_28);
  }
  return;
}

Assistant:

void TypeBuilder::createRecGroup(size_t index, size_t length) {
  assert(index <= size() && index + length <= size() && "group out of bounds");
  // Only materialize nontrivial recursion groups.
  if (length < 2) {
    return;
  }
  auto groupInfo = std::make_unique<RecGroupInfo>();
  groupInfo->reserve(length);
  for (size_t i = 0; i < length; ++i) {
    auto& info = impl->entries[index + i].info;
    assert(info->recGroup == nullptr && "group already assigned");
    groupInfo->push_back(asHeapType(info));
    info->recGroup = groupInfo.get();
    info->recGroupIndex = i;
  }
  impl->recGroups.insert(
    {RecGroup(uintptr_t(groupInfo.get())), std::move(groupInfo)});
}